

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<100UL> *
mserialize::cx_strcat<1ul,1ul,22ul,17ul,6ul,4ul,7ul,1ul,7ul,3ul,8ul,16ul,6ul,1ul>
          (cx_string<1UL> *strings,cx_string<1UL> *strings_1,cx_string<22UL> *strings_2,
          cx_string<17UL> *strings_3,cx_string<6UL> *strings_4,cx_string<4UL> *strings_5,
          cx_string<7UL> *strings_6,cx_string<1UL> *strings_7,cx_string<7UL> *strings_8,
          cx_string<3UL> *strings_9,cx_string<8UL> *strings_10,cx_string<16UL> *strings_11,
          cx_string<6UL> *strings_12,cx_string<1UL> *strings_13)

{
  cx_string<22UL> *in_RCX;
  cx_string<1UL> *in_RDX;
  cx_string<1UL> *in_RSI;
  cx_string<100UL> *in_RDI;
  cx_string<17UL> *in_R8;
  cx_string<6UL> *in_R9;
  cx_string<4UL> *in_stack_00000008;
  cx_string<7UL> *in_stack_00000010;
  size_t s;
  size_t i;
  char *out;
  size_t size [15];
  char *data [15];
  char buffer [101];
  char *in_stack_fffffffffffffe50;
  ulong local_1a8;
  char *local_1a0;
  size_t local_190 [15];
  char *local_118;
  data_ref local_110 [2];
  data_ref local_100;
  data_ref local_f8;
  data_ref local_f0;
  data_ref local_e8;
  data_ref local_e0;
  data_ref local_d8;
  data_ref local_d0;
  data_ref local_c8;
  data_ref local_c0;
  data_ref local_b8;
  data_ref local_b0;
  data_ref local_a8;
  char local_98 [112];
  cx_string<6UL> *local_28;
  cx_string<17UL> *local_20;
  cx_string<22UL> *local_18;
  cx_string<1UL> *local_10;
  cx_string<1UL> *local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_98,0,0x65);
  local_118 = "";
  local_110[0] = cx_string<1UL>::data(local_8);
  local_110[1] = cx_string<1UL>::data(local_10);
  local_100 = cx_string<22UL>::data(local_18);
  local_f8 = cx_string<17UL>::data(local_20);
  local_f0 = cx_string<6UL>::data(local_28);
  local_e8 = cx_string<4UL>::data(in_stack_00000008);
  local_e0 = cx_string<7UL>::data(in_stack_00000010);
  local_d8 = cx_string<1UL>::data((cx_string<1UL> *)s);
  local_d0 = cx_string<7UL>::data((cx_string<7UL> *)i);
  local_c8 = cx_string<3UL>::data((cx_string<3UL> *)out);
  local_c0 = cx_string<8UL>::data((cx_string<8UL> *)size[0]);
  local_b8 = cx_string<16UL>::data((cx_string<16UL> *)size[1]);
  local_b0 = cx_string<6UL>::data((cx_string<6UL> *)size[2]);
  local_a8 = cx_string<1UL>::data((cx_string<1UL> *)size[3]);
  local_190[0] = cx_string<1UL>::size(local_8);
  local_190[1] = cx_string<1UL>::size(local_10);
  local_190[2] = cx_string<22UL>::size(local_18);
  local_190[3] = cx_string<17UL>::size(local_20);
  local_190[4] = cx_string<6UL>::size(local_28);
  local_190[5] = cx_string<4UL>::size(in_stack_00000008);
  local_190[6] = cx_string<7UL>::size(in_stack_00000010);
  local_190[7] = cx_string<1UL>::size((cx_string<1UL> *)s);
  local_190[8] = cx_string<7UL>::size((cx_string<7UL> *)i);
  local_190[9] = cx_string<3UL>::size((cx_string<3UL> *)out);
  local_190[10] = cx_string<8UL>::size((cx_string<8UL> *)size[0]);
  local_190[0xb] = cx_string<16UL>::size((cx_string<16UL> *)size[1]);
  local_190[0xc] = cx_string<6UL>::size((cx_string<6UL> *)size[2]);
  local_190[0xd] = cx_string<1UL>::size((cx_string<1UL> *)size[3]);
  local_1a0 = local_98;
  for (local_1a8 = 1; local_1a8 < 0xf; local_1a8 = local_1a8 + 1) {
    for (in_stack_fffffffffffffe50 = (char *)0x0;
        in_stack_fffffffffffffe50 < (cx_string<100UL> *)local_190[local_1a8 - 1];
        in_stack_fffffffffffffe50 = in_stack_fffffffffffffe50 + 1) {
      *local_1a0 = in_stack_fffffffffffffe50[(long)local_110[local_1a8 - 1]];
      local_1a0 = local_1a0 + 1;
    }
  }
  cx_string<100UL>::cx_string((cx_string<100UL> *)in_stack_fffffffffffffe50,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}